

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Int.cpp
# Opt level: O2

string * __thiscall Lib::Int::toString_abi_cxx11_(string *__return_storage_ptr__,Int *this,long l)

{
  char tmp [256];
  allocator<char> local_119;
  char local_118 [264];
  
  snprintf(local_118,0x100,"%ld",this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_118,&local_119);
  return __return_storage_ptr__;
}

Assistant:

std::string Int::toString(long l)
{
  constexpr auto BUFSIZE = 256;
  char tmp [BUFSIZE];
  snprintf(tmp,BUFSIZE,"%ld",l);
  std::string result(tmp);

  return result;
}